

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O0

ResamplerFunc PrepareResampler(Resampler resampler,ALuint increment,InterpState *state)

{
  ResamplerFunc p_Var1;
  ALuint in_ESI;
  Resampler in_EDI;
  BSincTable *unaff_retaddr;
  
  if (Cubic < in_EDI) {
    if (in_EDI - FastBSinc12 < 2) {
      anon_unknown.dwarf_b2a6c::BsincPrepare(resampler,&state->bsinc,unaff_retaddr);
    }
    else if (in_EDI - FastBSinc24 < 2) {
      anon_unknown.dwarf_b2a6c::BsincPrepare(resampler,&state->bsinc,unaff_retaddr);
    }
  }
  p_Var1 = anon_unknown.dwarf_b2a6c::SelectResampler(in_EDI,in_ESI);
  return p_Var1;
}

Assistant:

ResamplerFunc PrepareResampler(Resampler resampler, ALuint increment, InterpState *state)
{
    switch(resampler)
    {
    case Resampler::Point:
    case Resampler::Linear:
    case Resampler::Cubic:
        break;
    case Resampler::FastBSinc12:
    case Resampler::BSinc12:
        BsincPrepare(increment, &state->bsinc, &bsinc12);
        break;
    case Resampler::FastBSinc24:
    case Resampler::BSinc24:
        BsincPrepare(increment, &state->bsinc, &bsinc24);
        break;
    }
    return SelectResampler(resampler, increment);
}